

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_stream_ack_one
              (quicly_conn_t *conn,quicly_stream_id_t stream_id,quicly_sendstate_sent_t *sent)

{
  quicly_sender_state_t qVar1;
  uint64_t uVar2;
  int iVar3;
  size_t in_RAX;
  quicly_stream_t *stream;
  size_t bytes_to_shift;
  size_t local_28;
  
  local_28 = in_RAX;
  stream = quicly_get_stream(conn,stream_id);
  if (stream == (quicly_stream_t *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = quicly_sendstate_acked(&stream->sendstate,sent,&local_28);
    if (iVar3 == 0) {
      if (local_28 != 0) {
        if (quicly_trace_fp != (FILE *)0x0) {
          on_ack_stream_ack_one_cold_1();
        }
        (*stream->callbacks->on_send_shift)(stream,local_28);
      }
      if (((((stream->recvstate).received.num_ranges == 0) &&
           (uVar2 = (stream->sendstate).final_size, uVar2 != 0xffffffffffffffff)) &&
          (((stream->sendstate).acked.ranges)->end == uVar2 + 1)) &&
         ((qVar1 = (stream->_send_aux).reset_stream.sender_state, qVar1 == QUICLY_SENDER_STATE_ACKED
          || (qVar1 == QUICLY_SENDER_STATE_NONE)))) {
        iVar3 = 0;
        destroy_stream(stream,0);
      }
      else {
        iVar3 = 0;
        if ((stream->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
          resched_stream_data(stream);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int on_ack_stream_ack_one(quicly_conn_t *conn, quicly_stream_id_t stream_id, quicly_sendstate_sent_t *sent)
{
    quicly_stream_t *stream;
    int ret;

    if ((stream = quicly_get_stream(conn, stream_id)) == NULL)
        return 0;

    size_t bytes_to_shift;
    if ((ret = quicly_sendstate_acked(&stream->sendstate, sent, &bytes_to_shift)) != 0)
        return ret;
    if (bytes_to_shift != 0) {
        QUICLY_PROBE(STREAM_ON_SEND_SHIFT, stream->conn, stream->conn->stash.now, stream, bytes_to_shift);
        stream->callbacks->on_send_shift(stream, bytes_to_shift);
    }
    if (stream_is_destroyable(stream)) {
        destroy_stream(stream, 0);
    } else if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
        resched_stream_data(stream);
    }

    return 0;
}